

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void fsync_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (req == &fsync_req) {
    if (fsync_req.fs_type == UV_FS_FSYNC) {
      if (fsync_req.result == 0) {
        fsync_cb_count = fsync_cb_count + 1;
        uv_fs_req_cleanup(&fsync_req);
        iVar1 = uv_fs_close(loop,&close_req,(uv_file)open_req1.result,close_cb);
        if (iVar1 == 0) {
          return;
        }
        pcVar3 = "r == 0";
        uVar2 = 0x1d1;
      }
      else {
        pcVar3 = "req->result == 0";
        uVar2 = 0x1cd;
      }
    }
    else {
      pcVar3 = "req->fs_type == UV_FS_FSYNC";
      uVar2 = 0x1cc;
    }
  }
  else {
    pcVar3 = "req == &fsync_req";
    uVar2 = 0x1cb;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void fsync_cb(uv_fs_t* req) {
  int r;
  ASSERT(req == &fsync_req);
  ASSERT(req->fs_type == UV_FS_FSYNC);
  ASSERT(req->result == 0);
  fsync_cb_count++;
  uv_fs_req_cleanup(req);
  r = uv_fs_close(loop, &close_req, open_req1.result, close_cb);
  ASSERT(r == 0);
}